

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.h
# Opt level: O2

float Assimp::PLY::PropertyInstance::ConvertTo<float>(ValueUnion v,EDataType eType)

{
  switch(eType) {
  case EDT_Char:
  case EDT_Short:
  case EDT_Int:
    return (float)v.iInt;
  case EDT_UChar:
  case EDT_UShort:
  case EDT_UInt:
    return (float)((ulong)v & 0xffffffff);
  case EDT_Float:
    return (float)v.iInt;
  case EDT_Double:
    return (float)v.fDouble;
  default:
    return 0.0;
  }
}

Assistant:

inline TYPE PLY::PropertyInstance::ConvertTo(
    PLY::PropertyInstance::ValueUnion v, PLY::EDataType eType)
{
    switch (eType)
    {
    case EDT_Float:
        return (TYPE)v.fFloat;
    case EDT_Double:
        return (TYPE)v.fDouble;

    case EDT_UInt:
    case EDT_UShort:
    case EDT_UChar:
        return (TYPE)v.iUInt;

    case EDT_Int:
    case EDT_Short:
    case EDT_Char:
        return (TYPE)v.iInt;
    default: ;
    };
    return (TYPE)0;
}